

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O1

void mz_zip_reader_sort_central_dir_offsets_by_filename(mz_zip_archive *pZip)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  undefined4 uVar6;
  mz_zip_internal_state *pmVar7;
  undefined4 *puVar8;
  void *pvVar9;
  void *pvVar10;
  void *pvVar11;
  void *pvVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  byte *pbVar17;
  ulong uVar18;
  byte bVar19;
  ulong uVar20;
  byte bVar21;
  ushort uVar22;
  long lVar23;
  mz_uint32 t_1;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  mz_uint32 t;
  byte *pbVar27;
  byte *pbVar28;
  bool bVar29;
  
  uVar4 = pZip->m_total_files;
  uVar16 = (ulong)uVar4;
  if (1 < uVar16) {
    pmVar7 = pZip->m_pState;
    puVar8 = (undefined4 *)(pmVar7->m_sorted_central_dir_offsets).m_p;
    uVar13 = uVar4 - 2 >> 1;
    do {
      uVar14 = (ulong)uVar13;
      uVar24 = uVar14 * 2 + 1;
      if (uVar24 < uVar16) {
        pvVar9 = (pmVar7->m_central_dir).m_p;
        pvVar10 = (pmVar7->m_central_dir_offsets).m_p;
        uVar25 = uVar14;
        do {
          if (uVar25 * 2 + 2 < uVar16) {
            pvVar11 = (pmVar7->m_central_dir).m_p;
            pvVar12 = (pmVar7->m_central_dir_offsets).m_p;
            uVar20 = (ulong)*(uint *)((long)pvVar12 + (ulong)(uint)puVar8[uVar24] * 4);
            uVar18 = (ulong)*(uint *)((long)pvVar12 + (ulong)(uint)puVar8[uVar25 * 2 + 2] * 4);
            pbVar17 = (byte *)((long)pvVar11 + uVar20 + 0x2e);
            uVar2 = *(ushort *)((long)pvVar11 + uVar20 + 0x1c);
            uVar3 = *(ushort *)((long)pvVar11 + uVar18 + 0x1c);
            uVar22 = uVar3;
            if (uVar2 < uVar3) {
              uVar22 = uVar2;
            }
            pbVar28 = (byte *)((long)pvVar11 + uVar22 + uVar20 + 0x2e);
            if (uVar22 == 0) {
              bVar19 = 0;
              bVar21 = 0;
            }
            else {
              pbVar27 = (byte *)((long)pvVar11 + uVar18 + 0x2e);
              do {
                bVar21 = *pbVar17;
                bVar19 = bVar21 + 0x20;
                if (0x19 < (byte)(bVar21 + 0xbf)) {
                  bVar19 = bVar21;
                }
                bVar1 = *pbVar27;
                bVar21 = bVar1 + 0x20;
                if (0x19 < (byte)(bVar1 + 0xbf)) {
                  bVar21 = bVar1;
                }
                if (bVar19 != bVar21) break;
                pbVar17 = pbVar17 + 1;
                pbVar27 = pbVar27 + 1;
              } while (pbVar17 < pbVar28);
            }
            bVar29 = bVar19 < bVar21;
            if (pbVar17 == pbVar28) {
              bVar29 = uVar2 < uVar3;
            }
            uVar18 = (ulong)bVar29;
          }
          else {
            uVar18 = 0;
          }
          uVar18 = uVar18 + uVar24;
          uVar5 = puVar8[uVar25];
          uVar24 = (ulong)*(uint *)((long)pvVar10 + (ulong)uVar5 * 4);
          uVar20 = (ulong)*(uint *)((long)pvVar10 + (ulong)(uint)puVar8[uVar18] * 4);
          pbVar17 = (byte *)((long)pvVar9 + uVar24 + 0x2e);
          uVar2 = *(ushort *)((long)pvVar9 + uVar24 + 0x1c);
          uVar3 = *(ushort *)((long)pvVar9 + uVar20 + 0x1c);
          uVar22 = uVar3;
          if (uVar2 < uVar3) {
            uVar22 = uVar2;
          }
          pbVar28 = (byte *)((long)pvVar9 + uVar22 + uVar24 + 0x2e);
          if (uVar22 == 0) {
            bVar19 = 0;
            bVar21 = 0;
          }
          else {
            pbVar27 = (byte *)((long)pvVar9 + uVar20 + 0x2e);
            do {
              bVar21 = *pbVar17;
              bVar19 = bVar21 + 0x20;
              if (0x19 < (byte)(bVar21 + 0xbf)) {
                bVar19 = bVar21;
              }
              bVar1 = *pbVar27;
              bVar21 = bVar1 + 0x20;
              if (0x19 < (byte)(bVar1 + 0xbf)) {
                bVar21 = bVar1;
              }
              if (bVar19 != bVar21) break;
              pbVar17 = pbVar17 + 1;
              pbVar27 = pbVar27 + 1;
            } while (pbVar17 < pbVar28);
          }
          bVar29 = bVar21 <= bVar19;
          if (pbVar17 == pbVar28) {
            bVar29 = uVar3 <= uVar2;
          }
          if (bVar29) break;
          puVar8[uVar25] = puVar8[uVar18];
          puVar8[uVar18] = uVar5;
          uVar24 = uVar18 * 2 + 1;
          uVar25 = uVar18;
        } while (uVar24 < uVar16);
      }
      bVar29 = uVar13 == 0;
      uVar13 = uVar13 - 1;
      if (bVar29) {
        uVar13 = 0;
      }
    } while (uVar14 != 0);
    if (uVar4 - 1 != 0) {
      uVar16 = (ulong)(uVar4 - 1);
      do {
        uVar6 = puVar8[uVar16];
        puVar8[uVar16] = *puVar8;
        *puVar8 = uVar6;
        if (1 < uVar16) {
          pvVar9 = (pmVar7->m_central_dir).m_p;
          pvVar10 = (pmVar7->m_central_dir_offsets).m_p;
          uVar24 = 1;
          lVar15 = 0;
          lVar23 = 0;
          do {
            if (lVar15 + 2U < uVar16) {
              pvVar11 = (pmVar7->m_central_dir).m_p;
              pvVar12 = (pmVar7->m_central_dir_offsets).m_p;
              uVar25 = (ulong)*(uint *)((long)pvVar12 + (ulong)(uint)puVar8[uVar24] * 4);
              uVar14 = (ulong)*(uint *)((long)pvVar12 + (ulong)(uint)puVar8[lVar15 + 2] * 4);
              pbVar17 = (byte *)((long)pvVar11 + uVar25 + 0x2e);
              uVar2 = *(ushort *)((long)pvVar11 + uVar25 + 0x1c);
              uVar3 = *(ushort *)((long)pvVar11 + uVar14 + 0x1c);
              uVar22 = uVar3;
              if (uVar2 < uVar3) {
                uVar22 = uVar2;
              }
              pbVar28 = (byte *)((long)pvVar11 + uVar22 + uVar25 + 0x2e);
              if (uVar22 == 0) {
                bVar21 = 0;
                bVar19 = 0;
              }
              else {
                pbVar27 = (byte *)((long)pvVar11 + uVar14 + 0x2e);
                do {
                  bVar19 = *pbVar17;
                  bVar21 = bVar19 + 0x20;
                  if (0x19 < (byte)(bVar19 + 0xbf)) {
                    bVar21 = bVar19;
                  }
                  bVar1 = *pbVar27;
                  bVar19 = bVar1 + 0x20;
                  if (0x19 < (byte)(bVar1 + 0xbf)) {
                    bVar19 = bVar1;
                  }
                  if (bVar21 != bVar19) break;
                  pbVar17 = pbVar17 + 1;
                  pbVar27 = pbVar27 + 1;
                } while (pbVar17 < pbVar28);
              }
              bVar29 = bVar21 < bVar19;
              if (pbVar17 == pbVar28) {
                bVar29 = uVar2 < uVar3;
              }
              uVar14 = (ulong)bVar29;
            }
            else {
              uVar14 = 0;
            }
            lVar26 = uVar14 + uVar24;
            uVar4 = puVar8[lVar23];
            uVar24 = (ulong)*(uint *)((long)pvVar10 + (ulong)uVar4 * 4);
            uVar14 = (ulong)*(uint *)((long)pvVar10 + (ulong)(uint)puVar8[lVar26] * 4);
            pbVar17 = (byte *)((long)pvVar9 + uVar24 + 0x2e);
            uVar2 = *(ushort *)((long)pvVar9 + uVar24 + 0x1c);
            uVar3 = *(ushort *)((long)pvVar9 + uVar14 + 0x1c);
            uVar22 = uVar3;
            if (uVar2 < uVar3) {
              uVar22 = uVar2;
            }
            pbVar28 = (byte *)((long)pvVar9 + uVar22 + uVar24 + 0x2e);
            if (uVar22 == 0) {
              bVar19 = 0;
              bVar21 = 0;
            }
            else {
              pbVar27 = (byte *)((long)pvVar9 + uVar14 + 0x2e);
              do {
                bVar21 = *pbVar17;
                bVar19 = bVar21 + 0x20;
                if (0x19 < (byte)(bVar21 + 0xbf)) {
                  bVar19 = bVar21;
                }
                bVar1 = *pbVar27;
                bVar21 = bVar1 + 0x20;
                if (0x19 < (byte)(bVar1 + 0xbf)) {
                  bVar21 = bVar1;
                }
                if (bVar19 != bVar21) break;
                pbVar17 = pbVar17 + 1;
                pbVar27 = pbVar27 + 1;
              } while (pbVar17 < pbVar28);
            }
            bVar29 = bVar21 <= bVar19;
            if (pbVar17 == pbVar28) {
              bVar29 = uVar3 <= uVar2;
            }
            if (bVar29) break;
            puVar8[lVar23] = puVar8[lVar26];
            puVar8[lVar26] = uVar4;
            lVar15 = lVar26 * 2;
            uVar24 = lVar26 * 2 + 1;
            lVar23 = lVar26;
          } while (uVar24 < uVar16);
        }
        uVar16 = uVar16 - 1;
      } while ((int)uVar16 != 0);
    }
  }
  return;
}

Assistant:

static void mz_zip_reader_sort_central_dir_offsets_by_filename(mz_zip_archive *pZip)
{
    mz_zip_internal_state *pState = pZip->m_pState;
    const mz_zip_array *pCentral_dir_offsets = &pState->m_central_dir_offsets;
    const mz_zip_array *pCentral_dir = &pState->m_central_dir;
    mz_uint32 *pIndices;
    mz_uint32 start, end;
    const mz_uint32 size = pZip->m_total_files;

    if (size <= 1U)
        return;

    pIndices = &MZ_ZIP_ARRAY_ELEMENT(&pState->m_sorted_central_dir_offsets, mz_uint32, 0);

    start = (size - 2U) >> 1U;
    for (;;)
    {
        mz_uint64 child, root = start;
        for (;;)
        {
            if ((child = (root << 1U) + 1U) >= size)
                break;
            child += (((child + 1U) < size) && (mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets, pIndices[child], pIndices[child + 1U])));
            if (!mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets, pIndices[root], pIndices[child]))
                break;
            MZ_SWAP_UINT32(pIndices[root], pIndices[child]);
            root = child;
        }
        if (!start)
            break;
        start--;
    }

    end = size - 1;
    while (end > 0)
    {
        mz_uint64 child, root = 0;
        MZ_SWAP_UINT32(pIndices[end], pIndices[0]);
        for (;;)
        {
            if ((child = (root << 1U) + 1U) >= end)
                break;
            child += (((child + 1U) < end) && mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets, pIndices[child], pIndices[child + 1U]));
            if (!mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets, pIndices[root], pIndices[child]))
                break;
            MZ_SWAP_UINT32(pIndices[root], pIndices[child]);
            root = child;
        }
        end--;
    }
}